

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:335:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:335:17)>
            *this)

{
  SegmentBuilder *node;
  void *pvVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  long *plVar4;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  bool bVar5;
  Own<capnp::ClientHook,_std::nullptr_t> OVar6;
  char *pcVar7;
  char *pcVar8;
  undefined8 uVar9;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_120;
  char *pcStack_e8;
  undefined8 local_e0;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_> local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c0;
  short local_b4;
  undefined4 local_b0;
  undefined8 *local_a8;
  long *local_a0;
  undefined1 local_98 [56];
  undefined8 *local_60;
  long *local_58;
  Maybe<capnp::MessageSize> local_50;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 local_20;
  
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            ((Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
              *)(local_98 + 0x10),&((this->f).env)->membraned,&local_50);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send(&local_120,
         (int)(Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
               *)(local_98 + 0x10),__buf,in_RCX,in_R8D);
  local_120.hook.ptr = (RequestHook *)0x4ddf3e;
  pcStack_e8 = "operator()";
  local_e0 = 0xc00000150;
  uVar9 = 0xc00000150;
  pcVar7 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
  ;
  pcVar8 = "operator()";
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>::wait
            (&local_d8,&local_120);
  bVar5 = local_b4 != 0;
  local_28 = 0;
  if (bVar5) {
    local_28 = local_c0;
  }
  local_20 = 0x7fffffff;
  if (bVar5) {
    local_20 = local_b0;
  }
  local_38 = 0;
  uStack_34 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  if (bVar5) {
    local_38 = local_d8.super_PromiseBase.node.ptr._0_4_;
    uStack_34 = local_d8.super_PromiseBase.node.ptr._4_4_;
    uStack_30 = uStack_d0;
    uStack_2c = uStack_cc;
  }
  OVar6 = capnp::_::PointerReader::getCapability((PointerReader *)local_98);
  plVar4 = local_a0;
  *(undefined4 *)&__return_storage_ptr__->field_0x8 = local_98._0_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_98._4_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x10 = local_98._8_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = local_98._12_4_;
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  if (local_a0 != (long *)0x0) {
    local_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,(long)plVar4 + *(long *)(*plVar4 + -0x10),OVar6.ptr);
  }
  uVar3 = local_120.super_Builder._builder._32_8_;
  pWVar2 = local_120.super_Builder._builder.pointers;
  if (local_120.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_120.super_Builder._builder.pointers = (WirePointer *)0x0;
    local_120.super_Builder._builder.dataSize = 0;
    local_120.super_Builder._builder.pointerCount = 0;
    local_120.super_Builder._builder._38_2_ = 0;
    (**(local_120.hook.disposer)->_vptr_Disposer)
              (local_120.hook.disposer,pWVar2,8,uVar3,uVar3,0,pcVar7,pcVar8,uVar9);
  }
  pvVar1 = local_120.super_Builder._builder.data;
  if ((long *)local_120.super_Builder._builder.data != (long *)0x0) {
    local_120.super_Builder._builder.data = (long *)0x0;
    (**((local_120.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_120.super_Builder._builder.capTable,(long)pvVar1 + *(long *)(*pvVar1 + -0x10));
  }
  node = local_120.super_Builder._builder.segment;
  if (local_120.super_Builder._builder.segment != (SegmentBuilder *)0x0) {
    local_120.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  plVar4 = local_58;
  if (local_58 != (long *)0x0) {
    local_58 = (long *)0x0;
    (**(code **)*local_60)(local_60,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }